

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_apu.c
# Opt level: O1

UINT8 nes_apu_read(void *chip,uint8 address)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  undefined3 in_register_00000031;
  
  if (CONCAT31(in_register_00000031,address) == 0x15) {
    bVar1 = 0 < *(int *)((long)chip + 0xc);
    bVar3 = bVar1 + 2;
    if (*(int *)((long)chip + 0x2c) < 1) {
      bVar3 = bVar1;
    }
    bVar2 = bVar3 + 4;
    if (*(int *)((long)chip + 0x50) < 1) {
      bVar2 = bVar3;
    }
    bVar3 = bVar2 | 8;
    if (*(int *)((long)chip + 0x6c) < 1) {
      bVar3 = bVar2;
    }
    bVar2 = bVar3 | 0x10;
    if (*(char *)((long)chip + 0x99) != '\x01') {
      bVar2 = bVar3;
    }
    bVar3 = bVar2 | 0x80;
    if (*(char *)((long)chip + 0x9a) != '\x01') {
      bVar3 = bVar2;
    }
    return bVar3;
  }
  return *(UINT8 *)((long)chip + (ulong)address + 0xb0);
}

Assistant:

uint8 nes_apu_read(void* chip, uint8 address)
{
	nesapu_state *info = (nesapu_state*)chip;
	
	if (address == 0x15) /*FIXED* Address $4015 has different behaviour*/
	{
		uint8 readval = 0;
		if (info->APU.squ[0].vbl_length > 0)
			readval |= 0x01;

		if (info->APU.squ[1].vbl_length > 0)
			readval |= 0x02;

		if (info->APU.tri.vbl_length > 0)
			readval |= 0x04;

		if (info->APU.noi.vbl_length > 0)
			readval |= 0x08;

		if (info->APU.dpcm.enabled == true)
			readval |= 0x10;

		if (info->APU.dpcm.irq_occurred == true)
			readval |= 0x80;

		return readval;
	}
	else
		return info->APU.regs[address];
}